

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_parser.hpp
# Opt level: O0

bool __thiscall
chaiscript::parser::
ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
::Statements(ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
             *this,bool t_class_allowed)

{
  undefined1 uVar1;
  bool bVar2;
  eval_error *peVar3;
  element_type *peVar4;
  bool local_f2;
  File_Position local_dc;
  allocator<char> local_d1;
  string local_d0;
  undefined1 local_ad;
  File_Position local_ac;
  allocator<char> local_a1;
  string local_a0;
  allocator<char> local_69;
  string local_68;
  undefined8 uStack_48;
  Position start;
  bool saw_eol;
  bool has_more;
  bool retval;
  Depth_Counter dc;
  bool t_class_allowed_local;
  ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
  *this_local;
  
  dc.parser._7_1_ = t_class_allowed;
  Depth_Counter::Depth_Counter((Depth_Counter *)&stack0xffffffffffffffe0,this);
  start._31_1_ = 0;
  start._30_1_ = 1;
  start._29_1_ = 1;
  while( true ) {
    while( true ) {
      while( true ) {
        uVar1 = start._31_1_;
        if (start._30_1_ == '\0') {
          Depth_Counter::~Depth_Counter((Depth_Counter *)&stack0xffffffffffffffe0);
          return (bool)(uVar1 & 1);
        }
        uStack_48._0_4_ = (this->m_position).line;
        uStack_48._4_4_ = (this->m_position).col;
        start._0_8_ = (this->m_position).m_pos;
        start.m_pos = (this->m_position).m_end;
        start.m_end = *(char **)&(this->m_position).m_last_col;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"",&local_69);
        bVar2 = Def(this,false,&local_68);
        local_f2 = true;
        if (!bVar2) {
          bVar2 = Try(this);
          local_f2 = true;
          if (!bVar2) {
            bVar2 = If(this);
            local_f2 = true;
            if (!bVar2) {
              bVar2 = While(this);
              local_f2 = true;
              if (!bVar2) {
                bVar2 = Class(this,(bool)(dc.parser._7_1_ & 1));
                local_f2 = true;
                if (!bVar2) {
                  bVar2 = For(this);
                  local_f2 = true;
                  if (!bVar2) {
                    local_f2 = Switch(this);
                  }
                }
              }
            }
          }
        }
        std::__cxx11::string::~string((string *)&local_68);
        std::allocator<char>::~allocator((allocator<char> *)&local_69);
        if (local_f2 == false) break;
        if ((start._29_1_ & 1) == 0) {
          local_ad = 1;
          peVar3 = (eval_error *)__cxa_allocate_exception(0x90);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_a0,"Two function definitions missing line separator",&local_a1
                    );
          File_Position::File_Position(&local_ac,(int)uStack_48,uStack_48._4_4_);
          peVar4 = Catch::clara::std::
                   __shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator*((__shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&this->m_filename);
          exception::eval_error::eval_error(peVar3,&local_a0,&local_ac,peVar4);
          local_ad = 0;
          __cxa_throw(peVar3,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
        }
        start._30_1_ = 1;
        start._31_1_ = 1;
        start._29_1_ = 1;
      }
      bVar2 = Return(this);
      if ((((bVar2) || (bVar2 = Break(this), bVar2)) || (bVar2 = Continue(this), bVar2)) ||
         (bVar2 = Equation(this), bVar2)) break;
      bVar2 = Block(this);
      if ((bVar2) || (bVar2 = Eol(this), bVar2)) {
        start._30_1_ = 1;
        start._31_1_ = 1;
        start._29_1_ = 1;
      }
      else {
        start._30_1_ = 0;
      }
    }
    if ((start._29_1_ & 1) == 0) break;
    start._30_1_ = 1;
    start._31_1_ = 1;
    start._29_1_ = 0;
  }
  peVar3 = (eval_error *)__cxa_allocate_exception(0x90);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"Two expressions missing line separator",&local_d1);
  File_Position::File_Position(&local_dc,(int)uStack_48,uStack_48._4_4_);
  peVar4 = Catch::clara::std::
           __shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&this->m_filename);
  exception::eval_error::eval_error(peVar3,&local_d0,&local_dc,peVar4);
  __cxa_throw(peVar3,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
}

Assistant:

bool Statements(const bool t_class_allowed = false) {
        Depth_Counter dc{this};
        bool retval = false;

        bool has_more = true;
        bool saw_eol = true;

        while (has_more) {
          const auto start = m_position;
          if (Def() || Try() || If() || While() || Class(t_class_allowed) || For() || Switch()) {
            if (!saw_eol) {
              throw exception::eval_error("Two function definitions missing line separator",
                                          File_Position(start.line, start.col),
                                          *m_filename);
            }
            has_more = true;
            retval = true;
            saw_eol = true;
          } else if (Return() || Break() || Continue() || Equation()) {
            if (!saw_eol) {
              throw exception::eval_error("Two expressions missing line separator", File_Position(start.line, start.col), *m_filename);
            }
            has_more = true;
            retval = true;
            saw_eol = false;
          } else if (Block() || Eol()) {
            has_more = true;
            retval = true;
            saw_eol = true;
          } else {
            has_more = false;
          }
        }

        return retval;
      }